

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_changeWindowLoc(void)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double local_68;
  double local_58;
  TAngle<double> local_40;
  double local_38;
  double oincy;
  double oincx;
  double incy;
  double incx;
  double oldmy;
  double oldmx;
  
  if ((((m_paninc.x != 0.0) || (NAN(m_paninc.x))) || (m_paninc.y != 0.0)) || (NAN(m_paninc.y))) {
    FBoolCVar::operator=(&am_followplayer,false);
    f_oldloc.x = 3.4028234663852886e+38;
  }
  dVar1 = m_paninc.x;
  oldmy = m_x;
  incx = m_y;
  incy = m_paninc.x;
  oincx = m_paninc.y;
  iVar3 = DCanvas::GetWidth((DCanvas *)screen);
  dVar2 = m_paninc.y;
  oincy = (dVar1 * (double)iVar3) / 320.0;
  incy = oincy;
  iVar3 = DCanvas::GetHeight((DCanvas *)screen);
  local_38 = (dVar2 * (double)iVar3) / 200.0;
  oincx = local_38;
  iVar3 = FIntCVar::operator_cast_to_int(&am_rotate);
  if ((iVar3 == 1) ||
     ((iVar3 = FIntCVar::operator_cast_to_int(&am_rotate), iVar3 == 2 && ((viewactive & 1U) != 0))))
  {
    TObjPtr<AActor>::operator->((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    TAngle<double>::operator-(&local_40,90.0);
    AM_rotate(&incy,&oincx,&local_40);
  }
  m_x = incy + m_x;
  m_y = oincx + m_y;
  AM_ClipRotatedExtents(oldmy + m_w / 2.0,incx + m_h / 2.0);
  if ((m_x != oldmy) || (NAN(m_x) || NAN(oldmy))) {
    local_58 = oincy;
  }
  else {
    local_58 = 0.0;
  }
  if ((m_y != incx) || (NAN(m_y) || NAN(incx))) {
    local_68 = -local_38;
  }
  else {
    local_68 = 0.0;
  }
  AM_ScrollParchment(local_58,local_68);
  return;
}

Assistant:

void AM_changeWindowLoc ()
{
	if (m_paninc.x || m_paninc.y)
	{
		am_followplayer = false;
		f_oldloc.x = FLT_MAX;
	}

	double oldmx = m_x, oldmy = m_y;
	double incx, incy, oincx, oincy;
	
	incx = m_paninc.x;
	incy = m_paninc.y;

	oincx = incx = m_paninc.x * SCREENWIDTH / 320;
	oincy = incy = m_paninc.y * SCREENHEIGHT / 200;
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotate(&incx, &incy, players[consoleplayer].camera->Angles.Yaw - 90.);
	}

	m_x += incx;
	m_y += incy;

	AM_ClipRotatedExtents (oldmx + m_w/2, oldmy + m_h/2);
	AM_ScrollParchment (m_x != oldmx ? oincx : 0, m_y != oldmy ? -oincy : 0);
}